

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  undefined8 extraout_RAX;
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"build/bin/1s.txt",&local_29);
  ReadLevelFile(&local_28,levelOne_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"build/bin/2s.txt",&local_29);
  ReadLevelFile(&local_28,levelTwo_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"build/bin/3s.txt",&local_29);
  ReadLevelFile(&local_28,levelThree_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"build/bin/4s.txt",&local_29);
  ReadLevelFile(&local_28,levelFour_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"build/bin/5s.txt",&local_29);
  ReadLevelFile(&local_28,levelFive_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_28);
  GameMenuOne();
  GameMenuTwo();
  PrintGameMenu();
  StartGame();
  std::__cxx11::string::~string((string *)&local_28);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main()
{

    ReadLevelFile("build/bin/1s.txt", levelOne);
    ReadLevelFile("build/bin/2s.txt", levelTwo);
    ReadLevelFile("build/bin/3s.txt", levelThree);
    ReadLevelFile("build/bin/4s.txt", levelFour);
    ReadLevelFile("build/bin/5s.txt", levelFive);
    GameMenuOne();
    GameMenuTwo();
    PrintGameMenu();
    StartGame();
    system("PAUSE");
}